

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

Value * duckdb::Value::MAP(Value *__return_storage_ptr__,
                          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *kv_pairs)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar1;
  Value *pVVar2;
  Value *pVVar3;
  Value *pVVar4;
  _func_int **pp_Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  _Hash_node_base *p_Var7;
  ExtraValueInfo *__tmp;
  long lVar8;
  Value *pVVar9;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>
  __l;
  allocator_type local_281;
  Value *local_280;
  Value *local_278;
  Value *pVStack_270;
  _func_int **local_268;
  undefined1 **local_258;
  string local_250;
  string local_230;
  LogicalType local_210;
  LogicalType local_1f8;
  LogicalType local_1e0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_1c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  local_1b0;
  undefined1 *local_150 [2];
  undefined1 local_140 [16];
  Value local_130;
  Value local_f0;
  Value local_b0;
  Value local_70;
  
  LogicalType::LogicalType(&local_1e0,SQLNULL);
  Value(__return_storage_ptr__,&local_1e0);
  LogicalType::~LogicalType(&local_1e0);
  LogicalType::LogicalType(&local_1f8,VARCHAR);
  LogicalType::LogicalType(&local_210,VARCHAR);
  LogicalType::MAP((LogicalType *)&local_1b0,&local_1f8,&local_210);
  (__return_storage_ptr__->type_).id_ = (LogicalTypeId)local_1b0.first._M_dataplus._M_p;
  (__return_storage_ptr__->type_).physical_type_ = local_1b0.first._M_dataplus._M_p._1_1_;
  peVar1 = (element_type *)
           CONCAT44(local_1b0.first._M_string_length._4_4_,
                    (undefined4)local_1b0.first._M_string_length);
  p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           CONCAT44(local_1b0.first.field_2._M_allocated_capacity._4_4_,
                    local_1b0.first.field_2._M_allocated_capacity._0_4_);
  local_1b0.first._M_string_length._0_4_ =
       *(undefined4 *)
        &(__return_storage_ptr__->type_).type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1b0.first._M_string_length._4_4_ =
       *(undefined4 *)
        ((long)&(__return_storage_ptr__->type_).type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4);
  local_1b0.first.field_2._M_allocated_capacity._0_4_ =
       *(undefined4 *)
        &(__return_storage_ptr__->type_).type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_1b0.first.field_2._M_allocated_capacity._4_4_ =
       *(undefined4 *)
        ((long)&(__return_storage_ptr__->type_).type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi + 4);
  (__return_storage_ptr__->type_).type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (__return_storage_ptr__->type_).type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var6;
  LogicalType::~LogicalType((LogicalType *)&local_1b0);
  LogicalType::~LogicalType(&local_210);
  LogicalType::~LogicalType(&local_1f8);
  __return_storage_ptr__->is_null = false;
  local_278 = (Value *)0x0;
  pVStack_270 = (Value *)0x0;
  local_268 = (_func_int **)0x0;
  p_Var7 = (kv_pairs->_M_h)._M_before_begin._M_nxt;
  local_280 = __return_storage_ptr__;
  if (p_Var7 != (_Hash_node_base *)0x0) {
    local_258 = local_150;
    do {
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_250,p_Var7[1]._M_nxt,
                 (long)&(p_Var7[1]._M_nxt)->_M_nxt + (long)&(p_Var7[2]._M_nxt)->_M_nxt);
      Value(&local_b0,&local_250);
      local_1b0.first._M_dataplus._M_p = (pointer)&local_1b0.first.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"key","");
      Value(&local_1b0.second,&local_b0);
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_230,p_Var7[5]._M_nxt,
                 (long)&(p_Var7[5]._M_nxt)->_M_nxt + (long)&(p_Var7[6]._M_nxt)->_M_nxt);
      Value(&local_f0,&local_230);
      local_150[0] = local_140;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"value","");
      Value(&local_130,&local_f0);
      __l._M_len = 2;
      __l._M_array = &local_1b0;
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ::vector(&local_1c8,__l,&local_281);
      STRUCT(&local_70,(child_list_t<Value> *)&local_1c8);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_278,&local_70);
      ~Value(&local_70);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ::~vector(&local_1c8);
      lVar8 = -0xc0;
      pVVar9 = &local_130;
      do {
        ~Value(pVVar9);
        if (&pVVar9[-1].value_info_ !=
            (shared_ptr<duckdb::ExtraValueInfo,_true> *)pVVar9[-1].value_.bigint) {
          operator_delete((undefined1 *)pVVar9[-1].value_.bigint);
        }
        pVVar9 = (Value *)&pVVar9[-2].value_;
        lVar8 = lVar8 + 0x60;
      } while (lVar8 != 0);
      ~Value(&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p);
      }
      ~Value(&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p);
      }
      p_Var7 = p_Var7->_M_nxt;
    } while (p_Var7 != (_Hash_node_base *)0x0);
  }
  p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  pp_Var5 = local_268;
  pVVar3 = pVStack_270;
  pVVar2 = local_278;
  pVVar9 = local_280;
  p_Var6->_M_use_count = 1;
  p_Var6->_M_weak_count = 1;
  p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0244e9c0;
  local_278 = (Value *)0x0;
  pVStack_270 = (Value *)0x0;
  local_268 = (_func_int **)0x0;
  *(undefined1 *)&p_Var6[1]._M_use_count = 2;
  p_Var6[1]._vptr__Sp_counted_base = (_func_int **)&PTR__NestedValueInfo_0244ea10;
  p_Var6[2]._vptr__Sp_counted_base = (_func_int **)pVVar2;
  *(Value **)&p_Var6[2]._M_use_count = pVVar3;
  p_Var6[3]._vptr__Sp_counted_base = pp_Var5;
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    UNLOCK();
  }
  else {
    p_Var6->_M_use_count = 2;
  }
  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  (pVVar9->value_info_).internal.
  super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var6 + 1);
  this = (pVVar9->value_info_).internal.
         super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pVVar9->value_info_).internal.
  super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var6;
  pVVar2 = local_278;
  pVVar3 = pVStack_270;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    pVVar2 = local_278;
    pVVar3 = pVStack_270;
  }
  for (; pVVar4 = pVStack_270, pVVar2 != pVStack_270; pVVar2 = pVVar2 + 1) {
    pVStack_270 = pVVar3;
    ~Value(pVVar2);
    pVVar3 = pVStack_270;
    pVStack_270 = pVVar4;
  }
  if (local_278 != (Value *)0x0) {
    pVStack_270 = pVVar3;
    operator_delete(local_278);
  }
  return pVVar9;
}

Assistant:

Value Value::MAP(const unordered_map<string, string> &kv_pairs) {
	Value result;
	result.type_ = LogicalType::MAP(LogicalType::VARCHAR, LogicalType::VARCHAR);
	result.is_null = false;
	vector<Value> pairs;
	for (auto &kv : kv_pairs) {
		pairs.push_back(Value::STRUCT({{"key", Value(kv.first)}, {"value", Value(kv.second)}}));
	}
	result.value_info_ = make_shared_ptr<NestedValueInfo>(std::move(pairs));
	return result;
}